

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manager.h
# Opt level: O2

void __thiscall Manager::Manager(Manager *this,int bRow,int bColumn,int Games)

{
  long lVar1;
  int i;
  ulong uVar2;
  Board local_70;
  int local_34;
  
  (this->puzzles).super__Vector_base<Board,_std::allocator<Board>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->puzzles).super__Vector_base<Board,_std::allocator<Board>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->puzzles).super__Vector_base<Board,_std::allocator<Board>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_34 = bColumn;
  std::vector<Board,_std::allocator<Board>_>::resize(&this->puzzles,(long)Games);
  lVar1 = 0;
  for (uVar2 = 0;
      uVar2 < (ulong)(((long)(this->puzzles).super__Vector_base<Board,_std::allocator<Board>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->puzzles).super__Vector_base<Board,_std::allocator<Board>_>.
                            _M_impl.super__Vector_impl_data._M_start) / 0x38); uVar2 = uVar2 + 1) {
    Board::Board(&local_70,bRow,local_34);
    Board::operator=((Board *)((long)&(((this->puzzles).
                                        super__Vector_base<Board,_std::allocator<Board>_>._M_impl.
                                        super__Vector_impl_data._M_start)->armada).
                                      super__Vector_base<Ship,_std::allocator<Ship>_> + lVar1),
                     &local_70);
    Board::~Board(&local_70);
    lVar1 = lVar1 + 0x38;
  }
  return;
}

Assistant:

Manager( int bRow, int bColumn, int Games )
        {

            // "allocating" the vector of vectors using the method resize()
            puzzles.resize( Games );

           for( int i = 0; i < puzzles.size(); i++ )
           {
              puzzles[i] = Board( bRow, bColumn );
           }

        }